

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcClosedShell::~IfcClosedShell(IfcClosedShell *this)

{
  void *pvVar1;
  
  *(undefined8 *)&this[-1].super_IfcConnectedFaceSet.field_0x50 = 0x8619d8;
  *(undefined8 *)&(this->super_IfcConnectedFaceSet).field_0x38 = 0x861a50;
  *(undefined8 *)&this[-1].field_0x60 = 0x861a00;
  (this->super_IfcConnectedFaceSet).super_IfcTopologicalRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x861a28;
  pvVar1 = *(void **)&(this->super_IfcConnectedFaceSet).super_IfcTopologicalRepresentationItem.
                      super_IfcRepresentationItem.
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                      field_0x10;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&(this->super_IfcConnectedFaceSet).
                                     super_IfcTopologicalRepresentationItem.
                                     super_IfcRepresentationItem.
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                     .field_0x20 - (long)pvVar1);
  }
  operator_delete(&this[-1].super_IfcConnectedFaceSet.field_0x50,0x70);
  return;
}

Assistant:

IfcClosedShell() : Object("IfcClosedShell") {}